

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Lib::Array<Parse::TPTP::Token>::expandToFit(Array<Parse::TPTP::Token> *this,size_t n)

{
  void *placement;
  Token *pTVar1;
  ulong in_RSI;
  Token *in_RDI;
  int i;
  Token *newArray;
  void *mem;
  size_t newCapacity;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  size_t in_stack_ffffffffffffffd8;
  ulong local_18;
  
  local_18 = *(long *)&in_RDI->content << 1;
  if (local_18 <= in_RSI) {
    local_18 = in_RSI + 1;
  }
  placement = Lib::alloc(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pTVar1 = array_new<Parse::TPTP::Token>(placement,in_stack_ffffffffffffffd8);
  if (*(long *)&in_RDI->content != 0) {
    in_stack_ffffffffffffffd4 = (int)*(undefined8 *)&in_RDI->content;
    while (in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + -1,
          -1 < in_stack_ffffffffffffffd4) {
      Parse::TPTP::Token::operator=
                ((Token *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
    }
  }
  if ((in_RDI->content)._M_string_length != 0) {
    array_delete<Parse::TPTP::Token>
              ((Token *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_t)in_RDI
              );
    Lib::free((void *)(in_RDI->content)._M_string_length);
  }
  (in_RDI->content)._M_string_length = (size_type)pTVar1;
  (*(code *)**(undefined8 **)in_RDI)(in_RDI,*(undefined8 *)&in_RDI->content,local_18);
  *(ulong *)&in_RDI->content = local_18;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }